

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2NodeTransformBlock(Parser *this,BaseNode *mesh)

{
  byte bVar1;
  size_t __n;
  _Alloc_hider _Var2;
  bool bVar3;
  uint i;
  int iVar4;
  int iVar5;
  Logger *pLVar6;
  byte *pbVar7;
  aiMatrix4x4 *apOut;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  string temp;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  aiMatrix4x4 *local_48;
  aiMatrix4x4 *local_40;
  aiMatrix4x4 *local_38;
  
  local_38 = &mesh->mTransform;
  local_40 = (aiMatrix4x4 *)&(mesh->mTransform).b1;
  local_48 = (aiMatrix4x4 *)&(mesh->mTransform).c1;
  iVar8 = 0;
  iVar11 = 0;
LAB_003e6c57:
  do {
    while( true ) {
      pbVar7 = (byte *)this->filePtr;
      bVar1 = *pbVar7;
      if (bVar1 == 0x2a) break;
LAB_003e6d68:
      bVar3 = false;
      if (bVar1 < 0x7b) {
        if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
          if (this->bLastWasEndLine != false) goto LAB_003e6ebd;
          this->iLineNumber = this->iLineNumber + 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          if (bVar1 == 0) {
            LogError(this,"Encountered unexpected EOL while parsing a *NODE_TM chunk (Level 2)");
          }
        }
      }
      else {
        if (bVar1 == 0x7d) {
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            this->filePtr = (char *)(pbVar7 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else {
          if (bVar1 != 0x7b) goto LAB_003e6ebf;
          iVar11 = iVar11 + 1;
        }
LAB_003e6ebd:
        bVar3 = false;
      }
LAB_003e6ebf:
      this->bLastWasEndLine = bVar3;
      this->filePtr = (char *)(pbVar7 + 1);
    }
    pbVar10 = pbVar7 + 1;
    this->filePtr = (char *)pbVar10;
    iVar4 = strncmp("NODE_NAME",(char *)pbVar10,9);
    if (iVar4 != 0) {
LAB_003e6c89:
      if (iVar8 != 0) {
        iVar4 = strncmp("TM_ROW3",(char *)pbVar10,7);
        if (iVar4 == 0) {
          bVar1 = pbVar7[8];
          if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            pbVar10 = pbVar7 + 9;
            if (bVar1 == 0) {
              pbVar10 = pbVar7 + 8;
            }
            this->filePtr = (char *)pbVar10;
            ParseLV4MeshFloatTriple
                      (this,(ai_real *)((long)&mesh->inherit + (ulong)(iVar8 != 1) * 0x10 + -0x1c));
            goto LAB_003e6c57;
          }
        }
        if (iVar8 == 1) {
          iVar4 = strncmp("TM_ROW0",(char *)pbVar10,7);
          if (iVar4 == 0) {
            bVar1 = pbVar7[8];
            if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            goto LAB_003e6cd4;
            pbVar10 = pbVar7 + 9;
            if (bVar1 == 0) {
              pbVar10 = pbVar7 + 8;
            }
            this->filePtr = (char *)pbVar10;
            apOut = local_38;
LAB_003e7080:
            ParseLV4MeshFloatTriple(this,&apOut->a1);
LAB_003e7085:
            iVar8 = 1;
            goto LAB_003e6c57;
          }
LAB_003e6cd4:
          iVar4 = strncmp("TM_ROW1",(char *)pbVar10,7);
          if (iVar4 == 0) {
            bVar1 = pbVar7[8];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar10 = pbVar7 + 9;
              if (bVar1 == 0) {
                pbVar10 = pbVar7 + 8;
              }
              this->filePtr = (char *)pbVar10;
              apOut = local_40;
              goto LAB_003e7080;
            }
          }
          iVar4 = strncmp("TM_ROW2",(char *)pbVar10,7);
          if (iVar4 == 0) {
            bVar1 = pbVar7[8];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar10 = pbVar7 + 9;
              if (bVar1 == 0) {
                pbVar10 = pbVar7 + 8;
              }
              this->filePtr = (char *)pbVar10;
              apOut = local_48;
              goto LAB_003e7080;
            }
          }
          iVar4 = strncmp("INHERIT_POS",(char *)pbVar10,0xb);
          if (iVar4 == 0) {
            bVar1 = pbVar7[0xc];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar10 = pbVar7 + 0xd;
              if (bVar1 == 0) {
                pbVar10 = pbVar7 + 0xc;
              }
              this->filePtr = (char *)pbVar10;
              lVar9 = 0;
              do {
                ParseLV4MeshLong(this,(uint *)((long)&local_88._M_dataplus._M_p + lVar9));
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              lVar9 = 0;
              do {
                (mesh->inherit).abInheritPosition[lVar9] =
                     *(int *)((long)&local_88._M_dataplus._M_p + lVar9 * 4) != 0;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              goto LAB_003e7085;
            }
          }
          iVar4 = strncmp("INHERIT_ROT",(char *)pbVar10,0xb);
          if (iVar4 == 0) {
            bVar1 = pbVar7[0xc];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar10 = pbVar7 + 0xd;
              if (bVar1 == 0) {
                pbVar10 = pbVar7 + 0xc;
              }
              this->filePtr = (char *)pbVar10;
              lVar9 = 0;
              do {
                ParseLV4MeshLong(this,(uint *)((long)&local_88._M_dataplus._M_p + lVar9));
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              lVar9 = 0;
              do {
                (mesh->inherit).abInheritRotation[lVar9] =
                     *(int *)((long)&local_88._M_dataplus._M_p + lVar9 * 4) != 0;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              goto LAB_003e7085;
            }
          }
          iVar4 = strncmp("INHERIT_SCL",(char *)pbVar10,0xb);
          if (iVar4 == 0) {
            bVar1 = pbVar7[0xc];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar10 = pbVar7 + 0xd;
              if (bVar1 == 0) {
                pbVar10 = pbVar7 + 0xc;
              }
              this->filePtr = (char *)pbVar10;
              lVar9 = 0;
              do {
                ParseLV4MeshLong(this,(uint *)((long)&local_88._M_dataplus._M_p + lVar9));
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              lVar9 = 0;
              do {
                (mesh->inherit).abInheritScaling[lVar9] =
                     *(int *)((long)&local_88._M_dataplus._M_p + lVar9 * 4) != 0;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              goto LAB_003e7085;
            }
          }
        }
      }
      bVar1 = *pbVar10;
      pbVar7 = pbVar10;
      goto LAB_003e6d68;
    }
    bVar1 = pbVar7[10];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_003e6c89;
    pbVar10 = pbVar7 + 0xb;
    if (bVar1 == 0) {
      pbVar10 = pbVar7 + 10;
    }
    this->filePtr = (char *)pbVar10;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    bVar3 = ParseString(this,&local_88,"*NODE_NAME");
    if (!bVar3) {
      SkipToNextToken(this);
    }
    if ((local_88._M_string_length != (mesh->mName)._M_string_length) ||
       ((iVar4 = 1, local_88._M_string_length != 0 &&
        (iVar5 = bcmp(local_88._M_dataplus._M_p,(mesh->mName)._M_dataplus._M_p,
                      local_88._M_string_length), iVar5 != 0)))) {
      lVar9 = std::__cxx11::string::find((char *)&local_88,0x708a8e,0);
      iVar4 = iVar8;
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_88);
        _Var2._M_p = local_68._M_dataplus._M_p;
        __n = (mesh->mName)._M_string_length;
        if (__n == local_68._M_string_length) {
          if (__n == 0) {
            bVar3 = true;
          }
          else {
            iVar5 = bcmp((mesh->mName)._M_dataplus._M_p,local_68._M_dataplus._M_p,__n);
            bVar3 = iVar5 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_68.field_2) {
          operator_delete(_Var2._M_p);
        }
        if (bVar3) {
          if (mesh->mType == Camera) {
            iVar5 = *(int *)&mesh[1].mName._M_dataplus._M_p;
joined_r0x003e709d:
            iVar4 = 2;
            if (iVar5 == 1) goto LAB_003e70b6;
          }
          else if (mesh->mType == Light) {
            iVar5 = *(int *)&mesh->field_0x154;
            goto joined_r0x003e709d;
          }
          pLVar6 = DefaultLogger::get();
          Logger::error(pLVar6,
                        "ASE: Ignoring target transform, this is no spot light or target camera");
          iVar4 = iVar8;
          goto LAB_003e70b6;
        }
      }
      pLVar6 = DefaultLogger::get();
      std::operator+(&local_68,"ASE: Unknown node transformation: ",&local_88);
      Logger::error(pLVar6,local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
LAB_003e70b6:
    iVar8 = iVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

void Parser::ParseLV2NodeTransformBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();
    int mode   = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // name of the node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                std::string::size_type s;
                if (temp == mesh.mName)
                {
                    mode = 1;
                }
                else if (std::string::npos != (s = temp.find(".Target")) &&
                    mesh.mName == temp.substr(0,s))
                {
                    // This should be either a target light or a target camera
                    if ( (mesh.mType == BaseNode::Light &&  ((ASE::Light&)mesh) .mLightType  == ASE::Light::TARGET) ||
                         (mesh.mType == BaseNode::Camera && ((ASE::Camera&)mesh).mCameraType == ASE::Camera::TARGET))
                    {
                        mode = 2;
                    }
                    else {
                        ASSIMP_LOG_ERROR("ASE: Ignoring target transform, "
                            "this is no spot light or target camera");
                    }
                }
                else
                {
                    ASSIMP_LOG_ERROR("ASE: Unknown node transformation: " + temp);
                    // mode = 0
                }
                continue;
            }
            if (mode)
            {
                // fourth row of the transformation matrix - and also the
                // only information here that is interesting for targets
                if (TokenMatch(filePtr,"TM_ROW3" ,7))
                {
                    ParseLV4MeshFloatTriple((mode == 1 ? mesh.mTransform[3] : &mesh.mTargetPosition.x));
                    continue;
                }
                if (mode == 1)
                {
                    // first row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW0" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[0]);
                        continue;
                    }
                    // second row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW1" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[1]);
                        continue;
                    }
                    // third row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW2" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[2]);
                        continue;
                    }
                    // inherited position axes
                    if (TokenMatch(filePtr,"INHERIT_POS" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritPosition[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited rotation axes
                    if (TokenMatch(filePtr,"INHERIT_ROT" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritRotation[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited scaling axes
                    if (TokenMatch(filePtr,"INHERIT_SCL" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritScaling[i] = aiVal[i] != 0;
                        continue;
                    }
                }
            }
        }
        AI_ASE_HANDLE_SECTION("2","*NODE_TM");
    }
    return;
}